

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_iter.cc
# Opt level: O0

Slice __thiscall leveldb::anon_unknown_3::DBIter::value(DBIter *this)

{
  Slice SVar1;
  int iVar2;
  undefined4 extraout_var;
  size_t extraout_RDX;
  DBIter *this_local;
  size_t local_10;
  
  if ((this->valid_ & 1U) != 0) {
    if (this->direction_ == kForward) {
      iVar2 = (*this->iter_->_vptr_Iterator[9])();
      this_local = (DBIter *)CONCAT44(extraout_var,iVar2);
      local_10 = extraout_RDX;
    }
    else {
      Slice::Slice((Slice *)&this_local,&this->saved_value_);
    }
    SVar1.size_ = local_10;
    SVar1.data_ = (char *)this_local;
    return SVar1;
  }
  __assert_fail("valid_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_iter.cc"
                ,0x45,"virtual Slice leveldb::(anonymous namespace)::DBIter::value() const");
}

Assistant:

Slice value() const override {
    assert(valid_);
    return (direction_ == kForward) ? iter_->value() : saved_value_;
  }